

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O2

uint32_t __thiscall
ans_fold_decode<4U>::decode_sym(ans_fold_decode<4U> *this,uint64_t *state,uint8_t **in_u8)

{
  dec_entry_fold *entry;
  uint8_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  entry = (this->table).super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
          super__Vector_impl_data._M_start + (this->frame_mask & *state);
  uVar3 = (ulong)entry->offset +
          (*state >> ((ulong)(byte)this->frame_log2 & 0x3f)) * (ulong)entry->freq;
  *state = uVar3;
  if (uVar3 < this->lower_bound) {
    puVar1 = *in_u8;
    *in_u8 = puVar1 + -4;
    *state = (ulong)*(uint *)(puVar1 + -4) | uVar3 << 0x20;
  }
  uVar2 = ans_fold_undo_mapping(entry,in_u8);
  return uVar2;
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        auto decoded_sym = ans_fold_undo_mapping(entry, in_u8);
        return decoded_sym;
    }